

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyHashingShardedKVS.hpp
# Opt level: O3

void __thiscall
supermap::
KeyHashingShardedKVS<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>
::add(KeyHashingShardedKVS<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>
      *this,Key<30UL> *key,MaybeRemovedValue<supermap::ByteArray<100UL>_> *value)

{
  pointer puVar1;
  __uniq_ptr_impl<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_>_>
  _Var2;
  Key<30UL> key_00;
  uint64_t uVar3;
  undefined2 local_2a;
  undefined6 uStack_28;
  
  uStack_28 = (undefined6)
              ((ulong)*(undefined8 *)((key->super_array<unsigned_char,_30UL>)._M_elems + 0xe) >>
              0x10);
  local_2a = (undefined2)
             ((ulong)*(undefined8 *)((key->super_array<unsigned_char,_30UL>)._M_elems + 8) >> 0x30);
  key_00.super_array<unsigned_char,_30UL>._M_elems[0xe] = (undefined1)local_2a;
  key_00.super_array<unsigned_char,_30UL>._M_elems[0xf] = local_2a._1_1_;
  key_00.super_array<unsigned_char,_30UL>._M_elems._0_14_ =
       *(undefined1 (*) [14])(key->super_array<unsigned_char,_30UL>)._M_elems;
  key_00.super_array<unsigned_char,_30UL>._M_elems[0x10] = (undefined1)uStack_28;
  key_00.super_array<unsigned_char,_30UL>._M_elems[0x11] = uStack_28._1_1_;
  key_00.super_array<unsigned_char,_30UL>._M_elems[0x12] = uStack_28._2_1_;
  key_00.super_array<unsigned_char,_30UL>._M_elems[0x13] = uStack_28._3_1_;
  key_00.super_array<unsigned_char,_30UL>._M_elems[0x14] = uStack_28._4_1_;
  key_00.super_array<unsigned_char,_30UL>._M_elems[0x15] = uStack_28._5_1_;
  key_00.super_array<unsigned_char,_30UL>._M_elems._22_8_ =
       *(undefined8 *)((key->super_array<unsigned_char,_30UL>)._M_elems + 0x16);
  uVar3 = hashTools::hashWith<supermap::Key<30ul>>
                    ((this->hasher_)._M_t.
                     super___uniq_ptr_impl<supermap::Hasher,_std::default_delete<supermap::Hasher>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_supermap::Hasher_*,_std::default_delete<supermap::Hasher>_>
                     .super__Head_base<0UL,_supermap::Hasher_*,_false>._M_head_impl,key_00,0xef);
  puVar1 = (this->nestedStorages_).
           super__Vector_base<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_t.
  super__Tuple_impl<0UL,_supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_*,_std::default_delete<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_>_>
  .
  super__Head_base<0UL,_supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_*,_false>
  ._M_head_impl =
       puVar1[uVar3 % (ulong)((long)(this->nestedStorages_).
                                    super__Vector_base<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)]
       ._M_t.
       super___uniq_ptr_impl<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_>_>
       ._M_t;
  (*(code *)**(undefined8 **)
              _Var2._M_t.
              super__Tuple_impl<0UL,_supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_*,_std::default_delete<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_>_>
              .
              super__Head_base<0UL,_supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_*,_false>
              ._M_head_impl)
            (_Var2._M_t.
             super__Tuple_impl<0UL,_supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_*,_std::default_delete<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_>_>
             .
             super__Head_base<0UL,_supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_*,_false>
             ._M_head_impl,key,value);
  return;
}

Assistant:

void add(const Key &key, Value &&value) override {
        nestedStorages_[getShardIdForKey(key)]->add(key, std::move(value));
    }